

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O3

int Kit_DsdCountLuts(Kit_DsdNtk_t *pNtk,int nLutSize)

{
  int iVar1;
  uint uVar2;
  uint Id;
  int Counter;
  int local_c;
  
  local_c = 0;
  Id = (uint)(pNtk->Root >> 1);
  if (Id < (uint)pNtk->nNodes + (uint)pNtk->nVars) {
    uVar2 = (uint)*pNtk->pNodes[(ulong)Id - (ulong)pNtk->nVars] & 0x1c0;
    iVar1 = 0;
    if ((uVar2 != 0x40) && (iVar1 = 0, uVar2 != 0x80)) {
      Kit_DsdCountLuts_rec(pNtk,nLutSize,Id,&local_c);
      iVar1 = -1;
      if (local_c < 1000) {
        iVar1 = local_c;
      }
    }
    return iVar1;
  }
  __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kit.h"
                ,0x99,"Kit_DsdObj_t *Kit_DsdNtkObj(Kit_DsdNtk_t *, int)");
}

Assistant:

int Kit_DsdCountLuts( Kit_DsdNtk_t * pNtk, int nLutSize )
{
    int Counter = 0;
    if ( Kit_DsdNtkRoot(pNtk)->Type == KIT_DSD_CONST1 )
        return 0;
    if ( Kit_DsdNtkRoot(pNtk)->Type == KIT_DSD_VAR )
        return 0;
    Kit_DsdCountLuts_rec( pNtk, nLutSize, Abc_Lit2Var(pNtk->Root), &Counter );
    if ( Counter >= 1000 )
        return -1;
    return Counter;
}